

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_sndio.c
# Opt level: O2

char * sndio_get_device(void)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar1 = getenv("AUDIODEVICE");
  if (pcVar1 == (char *)0x0) {
    pcVar2 = "snd/0";
  }
  else {
    pcVar2 = "snd/0";
    if (*pcVar1 != '\0') {
      pcVar2 = pcVar1;
    }
  }
  return pcVar2;
}

Assistant:

static const char *
sndio_get_device()
{
#ifdef __linux__
  /*
   * On other platforms default to sndio devices,
   * so cubebs other backends can be used instead.
   */
  const char * dev = getenv("AUDIODEVICE");
  if (dev == NULL || *dev == '\0')
    return "snd/0";
  return dev;
#else
  return SIO_DEVANY;
#endif
}